

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                   *this,arrays_type *new_arrays_)

{
  __atomic_base<unsigned_long> *p_Var1;
  anon_class_8_1_8991fb9c in_RSI;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_RDI;
  size_t num_destroyed;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *this_01;
  __atomic_base<unsigned_long> *this_02;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_stack_ffffffffffffffa0;
  anon_class_24_3_45a051ed in_stack_ffffffffffffffb0;
  __atomic_base<unsigned_long> *local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_10;
  
  local_18 = (__atomic_base<unsigned_long> *)0x0;
  this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             *)&stack0xffffffffffffffe8;
  this_00 = in_RDI;
  local_10 = in_RSI.this;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>::unchecked_rehash(boost::unordered::detail::foa::concurrent_table_arrays<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>&)::_lambda(std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>*)_1_>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0);
  this_02 = local_18;
  p_Var1 = (__atomic_base<unsigned_long> *)
           size((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 *)0x823ea9);
  if (this_02 != p_Var1) {
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
    ::
    for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>::unchecked_rehash(boost::unordered::detail::foa::concurrent_table_arrays<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>&)::_lambda(std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>*)_3_>
              (this_00,in_RSI);
  }
  delete_arrays(in_RSI.this,&this_00->arrays);
  memcpy(in_RDI,local_10,0x28);
  initial_max_load(this_01);
  std::__atomic_base<unsigned_long>::operator=(this_02,(__int_type_conflict1)this_01);
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }